

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O3

void __thiscall
TEST_GROUP_CppUTestGroupGlobalMemoryAccountant::~TEST_GROUP_CppUTestGroupGlobalMemoryAccountant
          (TEST_GROUP_CppUTestGroupGlobalMemoryAccountant *this)

{
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupGlobalMemoryAccountant_00389eb8;
  ExecFunctionWithoutParameters::~ExecFunctionWithoutParameters
            ((ExecFunctionWithoutParameters *)&this->testFunction);
  TestTestingFixture::~TestTestingFixture(&this->fixture);
  GlobalMemoryAccountant::~GlobalMemoryAccountant(&this->accountant);
  Utest::~Utest(&this->super_Utest);
  operator_delete(this,0x98);
  return;
}

Assistant:

TEST_GROUP(GlobalMemoryAccountant)
{
    GlobalMemoryAccountant accountant;
    TestTestingFixture fixture;
    GlobalMemoryAccountantExecFunction testFunction;
    GlobalMemoryAllocatorStash stash;

    void setup() _override
    {
        testFunction.parameter_ = &accountant;
        fixture.setTestFunction(&testFunction);
        stash.save();
    }

    void teardown() _override
    {
        stash.restore();
    }
}